

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O2

void __thiscall
Triangle::Triangle(Triangle *this,vec3f v1,vec3f v2,vec3f v3,vec2f vt1,vec2f vt2,vec2f vt3,vec3f vn1
                  ,vec3f vn2,vec3f vn3)

{
  undefined1 auVar1 [16];
  mat3f a;
  uint __line;
  data_t (*padVar2) [3];
  char *__assertion;
  float fVar3;
  float fVar4;
  data_t dVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vec3f vVar13;
  float fVar14;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 uVar15;
  vec3f local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  vec3f local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  vec3f local_48;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  data_t local_28;
  
  fVar4 = v3.z;
  fVar11 = v2.z;
  fVar9 = v2.x;
  fVar10 = v2.y;
  fVar7 = v1.z;
  fVar3 = v1.x;
  fVar6 = v1.y;
  (this->super_BasicPrimitive).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_001aeb90;
  (this->v1).x = (data_t)(int)v1._0_8_;
  (this->v1).y = (data_t)(int)((ulong)v1._0_8_ >> 0x20);
  (this->v1).z = fVar7;
  (this->v2).x = (data_t)(int)v2._0_8_;
  (this->v2).y = (data_t)(int)((ulong)v2._0_8_ >> 0x20);
  (this->v2).z = fVar11;
  (this->v3).x = (data_t)(int)v3._0_8_;
  (this->v3).y = (data_t)(int)((ulong)v3._0_8_ >> 0x20);
  (this->v3).z = fVar4;
  (this->vn1).z = vn1.z;
  (this->vn1).x = vn1.x;
  (this->vn1).y = vn1.y;
  (this->vn2).x = vn2.x;
  (this->vn2).y = vn2.y;
  (this->vn2).z = vn2.z;
  (this->vn3).x = vn3.x;
  (this->vn3).y = vn3.y;
  (this->vn3).z = vn3.z;
  auVar1._8_4_ = vt2.x;
  auVar1._0_8_ = vt1;
  auVar1._12_4_ = vt2.y;
  this->vt1 = vt1;
  (this->vt2).x = (data_t)(int)auVar1._8_8_;
  (this->vt2).y = (data_t)(int)((ulong)auVar1._8_8_ >> 0x20);
  this->vt3 = vt3;
  *(data_t *)((long)((this->tMatrix).data + 0) + 0) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 0) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[0] + 2) = 0;
  padVar2 = (this->tMatrix).data;
  *(data_t *)((long)(padVar2 + 1) + 4) = 0.0;
  *(data_t *)((long)(padVar2 + 1) + 8) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 2) + 0) = 0.0;
  *(data_t *)((long)((this->tMatrix).data + 2) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[2] + 2) = 0;
  (this->planeNormal).y = 0.0;
  (this->planeNormal).z = 0.0;
  if (SQRT((fVar7 - fVar11) * (fVar7 - fVar11) +
           (fVar3 - fVar9) * (fVar3 - fVar9) + (fVar6 - fVar10) * (fVar6 - fVar10)) <= 0.0) {
    __assertion = "norm(v1-v2)>0";
    __line = 0x18;
  }
  else {
    fVar12 = v3.x;
    fVar8 = v3.y;
    if (SQRT((fVar7 - fVar4) * (fVar7 - fVar4) +
             (fVar3 - fVar12) * (fVar3 - fVar12) + (fVar6 - fVar8) * (fVar6 - fVar8)) <= 0.0) {
      __assertion = "norm(v1-v3)>0";
      __line = 0x19;
    }
    else if (SQRT((fVar11 - fVar4) * (fVar11 - fVar4) +
                  (fVar9 - fVar12) * (fVar9 - fVar12) + (fVar10 - fVar8) * (fVar10 - fVar8)) <= 0.0)
    {
      __assertion = "norm(v2-v3)>0";
      __line = 0x1a;
    }
    else {
      fStack_84 = fVar12 - fVar3;
      fStack_80 = fVar10 - fVar3;
      fStack_7c = fVar8 - fVar3;
      fVar11 = fVar11 - fVar7;
      local_88 = fVar9 - fVar3;
      local_68 = fVar10 - fVar6;
      fStack_64 = fVar10;
      fStack_60 = fVar10;
      fStack_5c = fVar10;
      local_58 = fVar6;
      fStack_54 = fVar6;
      fStack_50 = fVar6;
      fStack_4c = fVar6;
      vVar13 = normalized((vec3f *)&stack0xffffffffffffff10);
      local_48.z = vVar13.z;
      local_48._0_8_ = vVar13._0_8_;
      fVar8 = fVar8 - local_58;
      fVar4 = fVar4 - fVar7;
      local_78.y = fVar8;
      local_78.x = fStack_84;
      fVar7 = fStack_84;
      fVar12 = fStack_84;
      fVar14 = fStack_84;
      local_78.z = fVar4;
      vVar13 = normalized(&local_78);
      local_98.z = vVar13.z;
      local_98._0_8_ = vVar13._0_8_;
      vVar13 = cross(&local_48,&local_98);
      if (1e-09 < SQRT(vVar13.z * vVar13.z + vVar13.x * vVar13.x + vVar13.y * vVar13.y)) {
        local_98.y = fVar8;
        local_98.x = fVar7;
        local_98.z = fVar4;
        vVar13 = cross((vec3f *)&stack0xffffffffffffff10,&local_98);
        local_48.z = vVar13.z;
        local_48._0_8_ = vVar13._0_8_;
        vVar13 = normalized(&local_48);
        (this->planeNormal).x = (data_t)(int)vVar13._0_8_;
        (this->planeNormal).y = (data_t)(int)((ulong)vVar13._0_8_ >> 0x20);
        (this->planeNormal).z = vVar13.z;
        dVar5 = dot(&this->planeNormal,&vn1);
        if (dVar5 < 0.0) {
          operator*=(&this->planeNormal,-1.0);
        }
        local_48.y = fVar8;
        local_48.x = fVar7;
        local_48.z = fVar4;
        vVar13 = cross(&local_48,(vec3f *)&stack0xffffffffffffff10);
        this->one_by_2S =
             1.0 / SQRT(vVar13.z * vVar13.z + vVar13.x * vVar13.x + vVar13.y * vVar13.y);
        uVar15._4_4_ = fVar10 - fVar6;
        uVar15._0_4_ = fVar9 - fVar3;
        local_78.y = fVar8;
        local_78.x = fVar7;
        local_78.z = fVar4;
        vVar13 = normalized(&local_78);
        local_98.z = vVar13.z;
        local_98._0_8_ = vVar13._0_8_;
        cross((vec3f *)&stack0xffffffffffffff10,&local_98);
        a.data[0][1] = fVar8;
        a.data[0][0] = fVar7;
        a.data[0][2] = fVar12;
        a.data[1][0] = fVar14;
        a.data[1][1] = (data_t)(int)in_stack_ffffffffffffff08;
        a.data[1][2] = (data_t)(int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        a.data[2][0] = (data_t)uVar15;
        a.data[2][1] = SUB84(uVar15,4);
        a.data[2][2] = fVar11;
        inverse(a);
        (this->tMatrix).data[2][2] = local_28;
        *(undefined8 *)((this->tMatrix).data[1] + 1) = local_38;
        *(undefined8 *)(this->tMatrix).data[2] = uStack_30;
        *(data_t *)((long)((this->tMatrix).data + 0) + 0) = local_48.x;
        *(data_t *)((long)((this->tMatrix).data + 0) + 4) = local_48.y;
        *(ulong *)((this->tMatrix).data[0] + 2) = CONCAT44(uStack_3c,local_48.z);
        return;
      }
      __assertion = "norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9";
      __line = 0x1b;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                ,__line,
                "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)")
  ;
}

Assistant:

Triangle(vec3f v1, vec3f v2, vec3f v3, vec2f vt1, vec2f vt2, vec2f vt3, vec3f vn1, vec3f vn2, vec3f vn3):
		v1(v1), v2(v2), v3(v3), vn1(vn1), vn2(vn2), vn3(vn3), vt1(vt1), vt2(vt2), vt3(vt3)
	// pre-calculation to accelerate intersection / interpolation computation
	{
		// NOTE: be careful when dealing with tiny triangles!
		assert(norm(v1-v2)>0);
		assert(norm(v1-v3)>0);
		assert(norm(v2-v3)>0);
		assert(norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9);

		planeNormal = normalized(cross(v2-v1, v3-v1));
		// make sure plane normal points outward
		if (dot(planeNormal, vn1) < 0)
			planeNormal *= -1;
		one_by_2S = 1 / norm(cross(v3-v1, v2-v1));
		tMatrix = inverse(mat3f(v2-v1, v3-v1, cross(v2-v1, normalized(v3-v1))));
	}